

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format.cpp
# Opt level: O1

void __thiscall format_decimal_Test::TestBody(format_decimal_Test *this)

{
  char *pcVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_68;
  string local_48;
  unsigned_long local_28;
  
  pcVar2 = local_68.m_buffer.m_data;
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{d}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{d}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{2}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{2}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf4,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{>2}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{>2}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf5,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<2}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{<2}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf6,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx  1234xx",0xb);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{6}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx  1234xx\" \"\", sizeof(\"xx  1234xx\") - 1)",
             "ST::format(\"xx{6}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx  1234xx",0xb);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{>6}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx  1234xx\" \"\", sizeof(\"xx  1234xx\") - 1)",
             "ST::format(\"xx{>6}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf8,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234  xx",0xb);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<6}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx1234  xx\" \"\", sizeof(\"xx1234  xx\") - 1)",
             "ST::format(\"xx{<6}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xf9,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx   -1234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0xfffffb2e);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{8}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx   -1234xx\" \"\", sizeof(\"xx   -1234xx\") - 1)",
             "ST::format(\"xx{8}xx\", -1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfa,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx   +1234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{+8}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx   +1234xx\" \"\", sizeof(\"xx   +1234xx\") - 1)",
             "ST::format(\"xx{+8}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfb,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx-1234   xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0xfffffb2e);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<8}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-1234   xx\" \"\", sizeof(\"xx-1234   xx\") - 1)",
             "ST::format(\"xx{<8}xx\", -1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx+1234   xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<+8}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+1234   xx\" \"\", sizeof(\"xx+1234   xx\") - 1)",
             "ST::format(\"xx{<+8}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0xfd,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx1234xx",9);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{.2}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx1234xx\" \"\", sizeof(\"xx1234xx\") - 1)"
             ,"ST::format(\"xx{.2}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x100,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx001234xx",0xb);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{06}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx001234xx\" \"\", sizeof(\"xx001234xx\") - 1)",
             "ST::format(\"xx{06}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x103,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx001234xx",0xb);
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<06}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx001234xx\" \"\", sizeof(\"xx001234xx\") - 1)",
             "ST::format(\"xx{<06}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x104,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx-0001234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0xfffffb2e);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{08}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-0001234xx\" \"\", sizeof(\"xx-0001234xx\") - 1)",
             "ST::format(\"xx{08}xx\", -1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x105,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx+0001234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{+08}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+0001234xx\" \"\", sizeof(\"xx+0001234xx\") - 1)",
             "ST::format(\"xx{+08}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x106,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx-0001234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0xfffffb2e);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<08}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-0001234xx\" \"\", sizeof(\"xx-0001234xx\") - 1)",
             "ST::format(\"xx{<08}xx\", -1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x107,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xc;
  builtin_strncpy(local_68.m_buffer.m_data,"xx+0001234xx",0xd);
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_28 = CONCAT44(local_28._4_4_,0x4d2);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{<+08}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+0001234xx\" \"\", sizeof(\"xx+0001234xx\") - 1)",
             "ST::format(\"xx{<+08}xx\", 1234)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x108,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffffffffff00;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<char>(&local_48,"xx{d}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{d}xx\", \'\\0\')",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 6;
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx65xx",7);
  local_28 = CONCAT71(local_28._1_7_,0x41);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<char>(&local_48,"xx{d}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx65xx\" \"\", sizeof(\"xx65xx\") - 1)",
             "ST::format(\"xx{d}xx\", \'A\')",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffff00000000;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<wchar_t>(&local_48,"xx{d}xx",(wchar_t *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'\\0\')",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 6;
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx65xx",7);
  local_28 = CONCAT44(local_28._4_4_,0x41);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<wchar_t>(&local_48,"xx{d}xx",(wchar_t *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx65xx\" \"\", sizeof(\"xx65xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'A\')",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 9;
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx32767xx",10);
  local_28 = CONCAT44(local_28._4_4_,0x7fff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<wchar_t>(&local_48,"xx{d}xx",(wchar_t *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx32767xx\" \"\", sizeof(\"xx32767xx\") - 1)",
             "ST::format(\"xx{d}xx\", L\'\\u7fff\')",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x10f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffffffffff00;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (signed char)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x112,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT71(local_28._1_7_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (signed char)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x113,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-123xx",9);
  local_28 = CONCAT71(local_28._1_7_,0x85);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)"
             ,"ST::format(\"xx{}xx\", (signed char)-123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x114,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffffffffff00;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_char>(&local_48,"xx{}xx",(uchar *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned char)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x115,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT71(local_28._1_7_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_char>(&local_48,"xx{}xx",(uchar *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned char)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x116,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"7xx",4);
  local_28 = CONCAT71(local_28._1_7_,0x7f);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx127xx\" \"\", sizeof(\"xx127xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int8_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x117,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx+127xx",9);
  local_28 = CONCAT71(local_28._1_7_,0x7f);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{+}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx+127xx\" \"\", sizeof(\"xx+127xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int8_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x118,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-128xx",9);
  local_28 = CONCAT71(local_28._1_7_,0x80);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-128xx\" \"\", sizeof(\"xx-128xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int8_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x119,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-128xx",9);
  local_28 = CONCAT71(local_28._1_7_,0x80);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<signed_char>(&local_48,"xx{+}xx",(char *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-128xx\" \"\", sizeof(\"xx-128xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int8_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx25",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"5xx",4);
  local_28 = CONCAT71(local_28._1_7_,0xff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_char>(&local_48,"xx{}xx",(uchar *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx255xx\" \"\", sizeof(\"xx255xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<uint8_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx+255xx",9);
  local_28 = CONCAT71(local_28._1_7_,0xff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_char>(&local_48,"xx{+}xx",(uchar *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx+255xx\" \"\", sizeof(\"xx+255xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<uint8_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffffffff0000;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (short)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x11f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT62(local_28._2_6_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (short)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x120,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-123xx",9);
  local_28 = CONCAT62(local_28._2_6_,0xff85);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)"
             ,"ST::format(\"xx{}xx\", (short)-123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x121,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffffffff0000;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_short>(&local_48,"xx{}xx",(unsigned_short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned short)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x122,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT62(local_28._2_6_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_short>(&local_48,"xx{}xx",(unsigned_short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned short)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x123,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 9;
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx32767xx",10);
  local_28 = CONCAT62(local_28._2_6_,0x7fff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx32767xx\" \"\", sizeof(\"xx32767xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int16_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x124,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx+32767xx",0xb);
  local_28 = CONCAT62(local_28._2_6_,0x7fff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{+}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+32767xx\" \"\", sizeof(\"xx+32767xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int16_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x125,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-32768xx",0xb);
  local_28 = CONCAT62(local_28._2_6_,0x8000);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-32768xx\" \"\", sizeof(\"xx-32768xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<int16_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x126,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-32768xx",0xb);
  local_28 = CONCAT62(local_28._2_6_,0x8000);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<short>(&local_48,"xx{+}xx",(short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-32768xx\" \"\", sizeof(\"xx-32768xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<int16_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x127,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 9;
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx65535xx",10);
  local_28 = CONCAT62(local_28._2_6_,0xffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_short>(&local_48,"xx{}xx",(unsigned_short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx65535xx\" \"\", sizeof(\"xx65535xx\") - 1)",
             "ST::format(\"xx{}xx\", std::numeric_limits<uint16_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x128,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 10;
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx+65535xx",0xb);
  local_28 = CONCAT62(local_28._2_6_,0xffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_short>(&local_48,"xx{+}xx",(unsigned_short *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+65535xx\" \"\", sizeof(\"xx+65535xx\") - 1)",
             "ST::format(\"xx{+}xx\", std::numeric_limits<uint16_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x129,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffff00000000;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (int)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,300,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT44(local_28._4_4_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (int)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-123xx",9);
  local_28 = CONCAT44(local_28._4_4_,0xffffff85);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)"
             ,"ST::format(\"xx{}xx\", (int)-123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = local_28 & 0xffffffff00000000;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_int>(&local_48,"xx{}xx",(uint *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned int)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x12f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = CONCAT44(local_28._4_4_,0x7b);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_int>(&local_48,"xx{}xx",(uint *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned int)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x130,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xe;
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx2147483647xx",0xf);
  local_28 = CONCAT44(local_28._4_4_,0x7fffffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx2147483647xx\" \"\", sizeof(\"xx2147483647xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int32_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x131,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xf;
  builtin_strncpy(local_68.m_buffer.m_data,"xx+2147483647xx",0x10);
  local_28 = CONCAT44(local_28._4_4_,0x7fffffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{+}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+2147483647xx\" \"\", sizeof(\"xx+2147483647xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int32_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x132,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xf;
  builtin_strncpy(local_68.m_buffer.m_data,"xx-2147483648xx",0x10);
  local_28 = CONCAT44(local_28._4_4_,0x80000000);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-2147483648xx\" \"\", sizeof(\"xx-2147483648xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int32_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x133,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xf;
  builtin_strncpy(local_68.m_buffer.m_data,"xx-2147483648xx",0x10);
  local_28 = CONCAT44(local_28._4_4_,0x80000000);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<int>(&local_48,"xx{+}xx",(int *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-2147483648xx\" \"\", sizeof(\"xx-2147483648xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int32_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x134,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xe;
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx4294967295xx",0xf);
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_int>(&local_48,"xx{}xx",(uint *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx4294967295xx\" \"\", sizeof(\"xx4294967295xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<uint32_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x135,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0xf;
  builtin_strncpy(local_68.m_buffer.m_data,"xx+4294967295xx",0x10);
  local_28 = CONCAT44(local_28._4_4_,0xffffffff);
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_int>(&local_48,"xx{+}xx",(uint *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+4294967295xx\" \"\", sizeof(\"xx+4294967295xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<uint32_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x136,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = 0;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long>(&local_48,"xx{}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (long)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x138,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = 0x7b;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long>(&local_48,"xx{}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x139,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-123xx",9);
  local_28 = 0xffffffffffffff85;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long>(&local_48,"xx{}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)"
             ,"ST::format(\"xx{}xx\", (long)-123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = 0;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_long>(&local_48,"xx{}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = 0x7b;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_long>(&local_48,"xx{}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = 0;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long_long>(&local_48,"xx{}xx",(longlong *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (long long)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x13f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = 0x7b;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long_long>(&local_48,"xx{}xx",(longlong *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (long long)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x140,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 8;
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx-123xx",9);
  local_28 = 0xffffffffffffff85;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<long_long>(&local_48,"xx{}xx",(longlong *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx-123xx\" \"\", sizeof(\"xx-123xx\") - 1)"
             ,"ST::format(\"xx{}xx\", (long long)-123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x141,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 5;
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx0xx",6);
  local_28 = 0;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_long_long>(&local_48,"xx{}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx0xx\" \"\", sizeof(\"xx0xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long long)0)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x142,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 7;
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  builtin_strncpy(local_68.m_buffer.m_data,"xx12",4);
  builtin_strncpy(local_68.m_buffer.m_data + 4,"3xx",4);
  local_28 = 0x7b;
  local_68.m_buffer.m_chars = pcVar2;
  ST::format<unsigned_long_long>(&local_48,"xx{}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,"ST::string::from_validated(\"\" \"xx123xx\" \"\", sizeof(\"xx123xx\") - 1)",
             "ST::format(\"xx{}xx\", (unsigned long long)123)",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && (local_68.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_68.m_buffer.m_chars != (char *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x17;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x18);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x3733333232397878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3734353836333032;
  builtin_strncpy((char *)((long)local_68.m_buffer.m_chars + 0xf),"775807xx",8);
  *(char *)((long)local_68.m_buffer.m_chars + 0x17) = '\0';
  local_28 = 0x7fffffffffffffff;
  ST::format<long>(&local_48,"xx{}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx9223372036854775807xx\" \"\", sizeof(\"xx9223372036854775807xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int64_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x18;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x19);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x33333232392b7878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3435383633303237;
  *(long *)((long)local_68.m_buffer.m_chars + 0x10) = 0x7878373038353737;
  *(char *)((long)local_68.m_buffer.m_chars + 0x18) = '\0';
  local_28 = 0x7fffffffffffffff;
  ST::format<long>(&local_48,"xx{+}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+9223372036854775807xx\" \"\", sizeof(\"xx+9223372036854775807xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int64_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x146,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x18;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x19);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x33333232392d7878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3435383633303237;
  *(long *)((long)local_68.m_buffer.m_chars + 0x10) = 0x7878383038353737;
  *(char *)((long)local_68.m_buffer.m_chars + 0x18) = '\0';
  local_28 = 0x8000000000000000;
  ST::format<long>(&local_48,"xx{}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-9223372036854775808xx\" \"\", sizeof(\"xx-9223372036854775808xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<int64_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x147,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x18;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x19);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x33333232392d7878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3435383633303237;
  *(long *)((long)local_68.m_buffer.m_chars + 0x10) = 0x7878383038353737;
  *(char *)((long)local_68.m_buffer.m_chars + 0x18) = '\0';
  local_28 = 0x8000000000000000;
  ST::format<long>(&local_48,"xx{+}xx",(long *)&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx-9223372036854775808xx\" \"\", sizeof(\"xx-9223372036854775808xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<int64_t>::min())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x148,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x18;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x19);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x3736343438317878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3930373337303434;
  *(long *)((long)local_68.m_buffer.m_chars + 0x10) = 0x7878353136313535;
  *(char *)((long)local_68.m_buffer.m_chars + 0x18) = '\0';
  local_28 = 0xffffffffffffffff;
  ST::format<unsigned_long>(&local_48,"xx{}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx18446744073709551615xx\" \"\", sizeof(\"xx18446744073709551615xx\") - 1)"
             ,"ST::format(\"xx{}xx\", std::numeric_limits<uint64_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_68.m_buffer.m_size = 0x19;
  local_68.m_buffer.m_data[0] = '\0';
  local_68.m_buffer.m_data[1] = '\0';
  local_68.m_buffer.m_data[2] = '\0';
  local_68.m_buffer.m_data[3] = '\0';
  local_68.m_buffer.m_data[4] = '\0';
  local_68.m_buffer.m_data[5] = '\0';
  local_68.m_buffer.m_data[6] = '\0';
  local_68.m_buffer.m_data[7] = '\0';
  local_68.m_buffer.m_data[8] = '\0';
  local_68.m_buffer.m_data[9] = '\0';
  local_68.m_buffer.m_data[10] = '\0';
  local_68.m_buffer.m_data[0xb] = '\0';
  local_68.m_buffer.m_data[0xc] = '\0';
  local_68.m_buffer.m_data[0xd] = '\0';
  local_68.m_buffer.m_data[0xe] = '\0';
  local_68.m_buffer.m_data[0xf] = '\0';
  local_68.m_buffer.m_chars = (char *)operator_new__(0x1a);
  *(undefined8 *)local_68.m_buffer.m_chars = 0x36343438312b7878;
  *(undefined8 *)((long)local_68.m_buffer.m_chars + 8) = 0x3037333730343437;
  builtin_strncpy((char *)((long)local_68.m_buffer.m_chars + 9),"44073709",8);
  builtin_strncpy((char *)((long)local_68.m_buffer.m_chars + 0x11),"551615xx",8);
  *(char *)((long)local_68.m_buffer.m_chars + 0x19) = '\0';
  local_28 = 0xffffffffffffffff;
  ST::format<unsigned_long>(&local_48,"xx{+}xx",&local_28);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_78,
             "ST::string::from_validated(\"\" \"xx+18446744073709551615xx\" \"\", sizeof(\"xx+18446744073709551615xx\") - 1)"
             ,"ST::format(\"xx{+}xx\", std::numeric_limits<uint64_t>::max())",&local_68,&local_48);
  if ((0xf < local_48.m_buffer.m_size) && (local_48.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_48.m_buffer.m_chars);
  }
  if ((0xf < local_68.m_buffer.m_size) && ((long *)local_68.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_68.m_buffer.m_chars);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_format.cpp"
               ,0x14a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_68.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_68.m_buffer.m_chars + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(format, decimal)
{
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{d}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{>2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{<2}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx  1234xx"), ST::format("xx{6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx  1234xx"), ST::format("xx{>6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx1234  xx"), ST::format("xx{<6}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx   -1234xx"), ST::format("xx{8}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx   +1234xx"), ST::format("xx{+8}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-1234   xx"), ST::format("xx{<8}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+1234   xx"), ST::format("xx{<+8}xx", 1234));

    // Ensure precision isn't used for numeric formatting
    EXPECT_EQ(ST_LITERAL("xx1234xx"), ST::format("xx{.2}xx", 1234));

    // Numeric padding
    EXPECT_EQ(ST_LITERAL("xx001234xx"), ST::format("xx{06}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx001234xx"), ST::format("xx{<06}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-0001234xx"), ST::format("xx{08}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+0001234xx"), ST::format("xx{+08}xx", 1234));
    EXPECT_EQ(ST_LITERAL("xx-0001234xx"), ST::format("xx{<08}xx", -1234));
    EXPECT_EQ(ST_LITERAL("xx+0001234xx"), ST::format("xx{<+08}xx", 1234));

    // Character types
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{d}xx", '\0'));
    EXPECT_EQ(ST_LITERAL("xx65xx"), ST::format("xx{d}xx", 'A'));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{d}xx", L'\0'));
    EXPECT_EQ(ST_LITERAL("xx65xx"), ST::format("xx{d}xx", L'A'));
    EXPECT_EQ(ST_LITERAL("xx32767xx"), ST::format("xx{d}xx", L'\u7fff'));

    // 8-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (signed char)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (signed char)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (signed char)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned char)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned char)123));
    EXPECT_EQ(ST_LITERAL("xx127xx"), ST::format("xx{}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+127xx"), ST::format("xx{+}xx", std::numeric_limits<int8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-128xx"), ST::format("xx{}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-128xx"), ST::format("xx{+}xx", std::numeric_limits<int8_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx255xx"), ST::format("xx{}xx", std::numeric_limits<uint8_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+255xx"), ST::format("xx{+}xx", std::numeric_limits<uint8_t>::max()));

    // 16-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (short)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (short)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (short)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned short)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned short)123));
    EXPECT_EQ(ST_LITERAL("xx32767xx"), ST::format("xx{}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+32767xx"), ST::format("xx{+}xx", std::numeric_limits<int16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-32768xx"), ST::format("xx{}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-32768xx"), ST::format("xx{+}xx", std::numeric_limits<int16_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx65535xx"), ST::format("xx{}xx", std::numeric_limits<uint16_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+65535xx"), ST::format("xx{+}xx", std::numeric_limits<uint16_t>::max()));

    // 32-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (int)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (int)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (int)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned int)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned int)123));
    EXPECT_EQ(ST_LITERAL("xx2147483647xx"), ST::format("xx{}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+2147483647xx"), ST::format("xx{+}xx", std::numeric_limits<int32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-2147483648xx"), ST::format("xx{}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-2147483648xx"), ST::format("xx{+}xx", std::numeric_limits<int32_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx4294967295xx"), ST::format("xx{}xx", std::numeric_limits<uint32_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+4294967295xx"), ST::format("xx{+}xx", std::numeric_limits<uint32_t>::max()));

    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (long)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned long)123));

    // 64-bit ints
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (long long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (long long)123));
    EXPECT_EQ(ST_LITERAL("xx-123xx"), ST::format("xx{}xx", (long long)-123));
    EXPECT_EQ(ST_LITERAL("xx0xx"), ST::format("xx{}xx", (unsigned long long)0));
    EXPECT_EQ(ST_LITERAL("xx123xx"), ST::format("xx{}xx", (unsigned long long)123));
#ifdef ST_HAVE_INT64
    EXPECT_EQ(ST_LITERAL("xx9223372036854775807xx"), ST::format("xx{}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+9223372036854775807xx"), ST::format("xx{+}xx", std::numeric_limits<int64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx-9223372036854775808xx"), ST::format("xx{}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx-9223372036854775808xx"), ST::format("xx{+}xx", std::numeric_limits<int64_t>::min()));
    EXPECT_EQ(ST_LITERAL("xx18446744073709551615xx"), ST::format("xx{}xx", std::numeric_limits<uint64_t>::max()));
    EXPECT_EQ(ST_LITERAL("xx+18446744073709551615xx"), ST::format("xx{+}xx", std::numeric_limits<uint64_t>::max()));
#endif
}